

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O3

void __thiscall Js::JavascriptRegExpConstructor::EnsureValues(JavascriptRegExpConstructor *this)

{
  charcount_t length;
  ScriptContext *scriptContext;
  RegexPattern *pattern;
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  charcount_t inputLength;
  Type TVar4;
  uint uVar5;
  char16 *input;
  GroupInfo GVar6;
  undefined4 *puVar7;
  JavascriptString *pJVar8;
  uint64 uVar9;
  uint64 uVar10;
  JavascriptString *pJVar11;
  Var pvVar12;
  Var pvVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  void *pvVar17;
  ulong uVar18;
  Type *pTVar19;
  double dVar20;
  
  if (this->reset != true) {
    if (this->invalidatedLastMatch != true) {
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                ,0x85,"(!invalidatedLastMatch)","!invalidatedLastMatch");
    if (bVar2) {
      *puVar7 = 0;
      return;
    }
LAB_00d03244:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  scriptContext =
       (((((this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  inputLength = JavascriptString::GetLength((this->lastInput).ptr);
  input = JavascriptString::GetString((this->lastInput).ptr);
  pattern = (this->lastPattern).ptr;
  if (this->invalidatedLastMatch == false) {
    TVar4 = (this->lastMatch).length;
  }
  else {
    GVar6 = RegexHelper::SimpleMatch(scriptContext,pattern,input,inputLength,0);
    (this->lastMatch).offset = GVar6.offset;
    (this->lastMatch).length = GVar6.length;
    this->invalidatedLastMatch = false;
    TVar4 = GVar6.length;
  }
  if (TVar4 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                ,0x5d,"(!lastMatch.IsUndefined())","!lastMatch.IsUndefined()");
    if (!bVar2) goto LAB_00d03244;
    *puVar7 = 0;
  }
  pJVar8 = JavascriptLibrary::GetEmptyString
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary);
  TVar4 = (this->lastMatch).length;
  if (TVar4 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/RegexRuntime.h"
                                ,0x60a,"(length != CharCountFlag)","length != CharCountFlag");
    if (!bVar2) goto LAB_00d03244;
    *puVar7 = 0;
    TVar4 = (this->lastMatch).length;
  }
  uVar5 = (this->lastMatch).offset;
  if ((long)(int)uVar5 < 0) {
    dVar20 = (double)uVar5;
    uVar9 = NumberUtilities::ToSpecial(dVar20);
    bVar2 = NumberUtilities::IsNan(dVar20);
    if (((bVar2) && (uVar10 = NumberUtilities::ToSpecial(dVar20), uVar10 != 0xfff8000000000000)) &&
       (uVar10 = NumberUtilities::ToSpecial(dVar20), uVar10 != 0x7ff8000000000000)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                  ,0xa2,
                                  "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                  ,"We should only produce a NaN with this value");
      if (!bVar2) goto LAB_00d03244;
      *puVar7 = 0;
    }
    pvVar17 = (void *)(uVar9 ^ 0xfffc000000000000);
  }
  else {
    pvVar17 = (void *)((long)(int)uVar5 | 0x1000000000000);
  }
  uVar5 = uVar5 + TVar4;
  Memory::Recycler::WBSetBit((char *)&this->index);
  (this->index).ptr = pvVar17;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->index);
  if ((int)uVar5 < 0) {
    dVar20 = (double)uVar5;
    uVar9 = NumberUtilities::ToSpecial(dVar20);
    bVar2 = NumberUtilities::IsNan(dVar20);
    if (((bVar2) && (uVar10 = NumberUtilities::ToSpecial(dVar20), uVar10 != 0xfff8000000000000)) &&
       (uVar10 = NumberUtilities::ToSpecial(dVar20), uVar10 != 0x7ff8000000000000)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                  ,0xa2,
                                  "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                  ,"We should only produce a NaN with this value");
      if (!bVar2) goto LAB_00d03244;
      *puVar7 = 0;
    }
    pvVar17 = (void *)(uVar9 ^ 0xfffc000000000000);
  }
  else {
    pvVar17 = (void *)((ulong)uVar5 | 0x1000000000000);
  }
  Memory::Recycler::WBSetBit((char *)&this->lastIndex);
  (this->lastIndex).ptr = pvVar17;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastIndex);
  length = (this->lastMatch).offset;
  pJVar11 = pJVar8;
  if (length != 0) {
    pJVar11 = SubString::New((this->lastInput).ptr,0,length);
  }
  Memory::Recycler::WBSetBit((char *)&this->leftContext);
  (this->leftContext).ptr = pJVar11;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->leftContext);
  pJVar11 = pJVar8;
  if ((uVar5 <= inputLength && inputLength - uVar5 != 0) && uVar5 != 0) {
    pJVar11 = SubString::New((this->lastInput).ptr,uVar5,inputLength - uVar5);
  }
  Memory::Recycler::WBSetBit((char *)&this->rightContext);
  (this->rightContext).ptr = pJVar11;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->rightContext);
  pvVar12 = RegexHelper::NonMatchValue(scriptContext,true);
  GVar6.offset = (this->lastMatch).offset;
  GVar6.length = (this->lastMatch).length;
  pvVar13 = RegexHelper::GetString(scriptContext,(this->lastInput).ptr,pvVar12,GVar6);
  Memory::Recycler::WBSetBit((char *)this->captures);
  this->captures[0].ptr = pvVar13;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this->captures);
  uVar3 = UnifiedRegex::RegexPattern::NumGroups(pattern);
  uVar14 = (ulong)uVar3;
  if (uVar3 < 2) {
    Memory::Recycler::WBSetBit((char *)&this->lastParen);
    (this->lastParen).ptr = pJVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastParen);
  }
  else {
    bVar2 = UnifiedRegex::RegexPattern::WasLastMatchSuccessful(pattern);
    if (!bVar2) {
      RegexHelper::SimpleMatch(scriptContext,pattern,input,inputLength,(this->lastMatch).offset);
    }
    bVar2 = UnifiedRegex::RegexPattern::WasLastMatchSuccessful(pattern);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                  ,0x72,"(pattern->WasLastMatchSuccessful())",
                                  "pattern->WasLastMatchSuccessful()");
      if (!bVar2) goto LAB_00d03244;
      *puVar7 = 0;
    }
    uVar5 = 10;
    if (uVar3 < 10) {
      uVar5 = (uint)uVar3;
    }
    uVar15 = 2;
    if (2 < uVar5) {
      uVar15 = (ulong)uVar5;
    }
    pTVar19 = this->captures;
    uVar18 = 1;
    do {
      pTVar19 = pTVar19 + 1;
      pvVar13 = RegexHelper::GetGroup
                          (scriptContext,pattern,(this->lastInput).ptr,pvVar12,(int)uVar18);
      Memory::Recycler::WBSetBit((char *)pTVar19);
      pTVar19->ptr = pvVar13;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar19);
      uVar18 = uVar18 + 1;
    } while (uVar15 != uVar18);
    if (uVar3 < 0xb) {
      pvVar12 = this->captures[uVar14 - 1].ptr;
    }
    else {
      pvVar12 = RegexHelper::GetGroup(scriptContext,pattern,(this->lastInput).ptr,pvVar12,uVar3 - 1)
      ;
    }
    Memory::Recycler::WBSetBit((char *)&this->lastParen);
    (this->lastParen).ptr = pvVar12;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastParen);
    if (9 < uVar3) goto LAB_00d0322d;
  }
  pTVar19 = this->captures + uVar14;
  lVar16 = uVar14 - 10;
  do {
    Memory::Recycler::WBSetBit((char *)pTVar19);
    pTVar19->ptr = pJVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar19);
    pTVar19 = pTVar19 + 1;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0);
LAB_00d0322d:
  this->reset = false;
  return;
}

Assistant:

void JavascriptRegExpConstructor::EnsureValues()
    {
        if (reset)
        {
            ScriptContext* scriptContext = this->GetScriptContext();
            const CharCount lastInputLen = lastInput->GetLength();
            const char16* lastInputStr = lastInput->GetString();
            UnifiedRegex::RegexPattern* pattern = lastPattern;

            // When we perform a regex test operation it's possible the result of the operation will be loaded from a cache and the match will not be computed and updated in the ctor.
            // In that case we invalidate the last match stored in the ctor and will need to compute it before it will be accessible via $1 etc.
            // Since we only do this for the case of RegExp.prototype.test cache hit, we know several things:
            //  - The regex is not global or sticky
            //  - There was a match (test returned true)
            if (invalidatedLastMatch)
            {
                this->lastMatch = RegexHelper::SimpleMatch(scriptContext, pattern, lastInputStr, lastInputLen, 0);
                invalidatedLastMatch = false;
            }

            Assert(!lastMatch.IsUndefined());
            JavascriptString* emptyString = scriptContext->GetLibrary()->GetEmptyString();
            CharCount lastIndexVal = lastMatch.EndOffset();
            this->index = JavascriptNumber::ToVar(lastMatch.offset, scriptContext);
            this->lastIndex = JavascriptNumber::ToVar(lastIndexVal, scriptContext);
            this->leftContext = lastMatch.offset > 0 ? SubString::New(lastInput, 0, lastMatch.offset) : emptyString;
            this->rightContext = lastIndexVal > 0 && lastIndexVal < lastInputLen ? SubString::New(lastInput, lastIndexVal, lastInputLen - lastIndexVal) : emptyString;

            Var nonMatchValue = RegexHelper::NonMatchValue(scriptContext, true);
            captures[0] = RegexHelper::GetString(scriptContext, lastInput, nonMatchValue, lastMatch);
            int numGroups = pattern->NumGroups();
            if (numGroups > 1)
            {
                // The RegExp constructor's lastMatch holds the last *successful* match on any regular expression.
                // That regular expression may since have been used for *unsuccessful* matches, in which case
                // its groups will have been reset. Updating the RegExp constructor with the group binding after
                // every match is prohibitively slow. Instead, run the match again using the known last input string.
                if (!pattern->WasLastMatchSuccessful())
                {
                    RegexHelper::SimpleMatch(scriptContext, pattern, lastInputStr, lastInputLen, lastMatch.offset);
                }
                Assert(pattern->WasLastMatchSuccessful());
                for (int groupId = 1; groupId < min(numGroups, NumCtorCaptures); groupId++)
                    captures[groupId] = RegexHelper::GetGroup(scriptContext, pattern, lastInput, nonMatchValue, groupId);

                this->lastParen = numGroups <= NumCtorCaptures ?
                    PointerValue(captures[numGroups - 1]) :
                    RegexHelper::GetGroup(scriptContext, pattern, lastInput, nonMatchValue, numGroups - 1);
            }
            else
            {
                this->lastParen = emptyString;
            }
            for (int groupId = numGroups; groupId < NumCtorCaptures; groupId++)
                captures[groupId] = emptyString;
            reset = false;
        }
        else
        {
            // If we are not resetting the values, the last match cannot be invalidated.
            Assert(!invalidatedLastMatch);
        }
    }